

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O3

RatioSequence * __thiscall
RatioSequence::getNonDesRSWithMinDist(RatioSequence *__return_storage_ptr__,RatioSequence *this)

{
  vector<Ratio,_std::allocator<Ratio>_> *this_00;
  int iVar1;
  RatioSequence *pRVar2;
  ulong uVar3;
  int *piVar4;
  pointer pRVar5;
  pointer pRVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  vector<int,_std::allocator<int>_> ccArray;
  Ratio combinedRatio;
  allocator_type local_a1;
  RatioSequence *local_a0;
  RatioSequence *local_98;
  double local_90;
  vector<int,_std::allocator<int>_> local_88;
  Ratio local_70;
  
  pRVar5 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar6 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a0 = __return_storage_ptr__;
  RatioSequence(__return_storage_ptr__,this);
  if (0x40 < (ulong)((long)pRVar5 - (long)pRVar6)) {
    local_70.eLength._0_4_ = 0;
    local_98 = this;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_88,
               (long)(this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 6,(value_type_conflict3 *)&local_70
               ,&local_a1);
    pRVar5 = (local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pRVar5 != 0x40) {
      this_00 = &local_a0->_RatioSequence;
      iVar8 = 0;
      uVar7 = 0;
      do {
        local_90 = Ratio::getRatio(pRVar5 + uVar7);
        uVar9 = uVar7 + 1;
        dVar11 = Ratio::getRatio((this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar9);
        if (local_90 <= dVar11) {
          uVar7 = (ulong)iVar8;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = 0;
          uVar3 = ((long)(local_98->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(local_98->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6) - 1;
          if (uVar7 < uVar3) {
            do {
              if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] == 2) break;
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar3);
            iVar8 = (int)uVar7;
          }
        }
        else {
          pRVar5 = (this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          Ratio::combine(&local_70,pRVar5 + uVar7,pRVar5 + uVar9);
          std::vector<Ratio,_std::allocator<Ratio>_>::_M_erase
                    (this_00,(this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar7);
          std::vector<Ratio,_std::allocator<Ratio>_>::_M_erase
                    (this_00,(this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar7);
          std::vector<Ratio,_std::allocator<Ratio>_>::insert
                    (this_00,(this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar7,&local_70);
          uVar3 = (ulong)iVar8;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar3] = 1;
          if (uVar7 == 0) {
            uVar7 = ((long)(local_98->_RatioSequence).
                           super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(local_98->_RatioSequence).
                           super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                           super__Vector_impl_data._M_start >> 6) - 1;
            if (uVar3 < uVar7) {
              do {
                if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3] == 2) break;
                uVar3 = uVar3 + 1;
              } while (uVar3 < uVar7);
              uVar9 = 0;
              iVar8 = (int)uVar3;
            }
            else {
              uVar9 = 0;
            }
          }
          else {
            iVar8 = iVar8 + 1;
            piVar4 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar3;
            do {
              iVar8 = iVar8 + -1;
              iVar1 = *piVar4;
              piVar4 = piVar4 + -1;
            } while (iVar1 == 1);
            uVar9 = uVar7 - 1;
          }
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.fEdges);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.eEdges);
        }
        pRVar5 = (local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar9;
      } while (uVar9 < ((long)(local_a0->_RatioSequence).
                              super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pRVar5 >> 6) - 1U);
    }
    pRVar2 = local_98;
    pRVar5 = (local_98->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar6 = (local_98->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pRVar6 - (long)pRVar5 == 0x40) {
      lVar10 = 0;
    }
    else {
      uVar7 = 0;
      lVar10 = 0;
      do {
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar7] == 1) {
          auVar12._8_4_ = (int)(uVar7 >> 0x20);
          auVar12._0_8_ = uVar7;
          auVar12._12_4_ = 0x45300000;
          dVar11 = exp2((auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
          lVar10 = (long)((double)lVar10 + dVar11);
          pRVar5 = (pRVar2->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pRVar6 = (pRVar2->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < ((long)pRVar6 - (long)pRVar5 >> 6) - 1U);
    }
    local_a0->combineCode = lVar10;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return local_a0;
}

Assistant:

RatioSequence RatioSequence::getNonDesRSWithMinDist() {
    if (this->size() < 2) {
        return *this;
    }
    RatioSequence combinedRS(*this);
    size_t i = 0;   // index for stepping through rs
    long combineCode = 0;
    vector<int> ccArray(this->size(), 0);

    int a = 0; // array index

    while (i < combinedRS.size() - 1) {
        if (combinedRS[i].getRatio() > combinedRS[i + 1].getRatio()) {
            Ratio combinedRatio = Ratio::combine(combinedRS[i], combinedRS[i + 1]);
            combinedRS.erase(i);
            combinedRS.erase(i);
            combinedRS._RatioSequence.insert(combinedRS._RatioSequence.begin() + i, combinedRatio);
            ccArray[a] = 1;
            if (i > 0) {
                i--;
                // go back in the array to the last non-combined ratio
                while (ccArray[a] == 1) {
                    a--;
                }
            } else {
                // we must advance a
                while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                    a++;
                }
            }
        } else {
            ccArray[a] = 0;
            // the ratios are not-descending, so go on to the next pair
            i++;
            // we must jump ahead to the next ratio not considered for combination
            while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                a++;
            }
        }
    }

    for (size_t k = 0; k < this->size() - 1; k++) {
        if (ccArray[k] == 1) {
            combineCode += pow(2, k);
        }
    }
    combinedRS.setCombineCode(combineCode);

    return combinedRS;
}